

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  string_t element;
  string_t element_00;
  string_t element_01;
  string_t element_02;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar5 = 0;
      uVar7 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = puVar1[uVar5];
        }
        uVar6 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar6 = count;
        }
        uVar10 = uVar6;
        if (uVar8 != 0) {
          uVar10 = uVar7;
          if (uVar8 == 0xffffffffffffffff) {
            if (uVar7 < uVar6) {
              pdVar9 = pdVar3 + uVar7 * 0x10 + 8;
              do {
                element.value.pointer.ptr = (char *)*(undefined8 *)pdVar9;
                element.value._0_8_ = *(undefined8 *)(pdVar9 + -8);
                QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                          ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                           element,aggr_input_data);
                uVar7 = uVar7 + 1;
                pdVar9 = pdVar9 + 0x10;
                uVar10 = uVar7;
              } while (uVar6 != uVar7);
            }
          }
          else if (uVar7 < uVar6) {
            pdVar9 = pdVar3 + uVar7 * 0x10 + 8;
            uVar10 = 0;
            do {
              if ((uVar8 >> (uVar10 & 0x3f) & 1) != 0) {
                element_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar9;
                element_00.value._0_8_ = *(undefined8 *)(pdVar9 + -8);
                QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                          ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                           element_00,aggr_input_data);
              }
              uVar10 = uVar10 + 1;
              pdVar9 = pdVar9 + 0x10;
            } while ((uVar7 - uVar6) + uVar10 != 0);
            uVar10 = uVar7 + uVar10;
          }
        }
        uVar5 = uVar5 + 1;
        uVar7 = uVar10;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) && (count != 0)) {
      paVar2 = (anon_union_16_2_67f50693_for_value *)input->data;
      do {
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                   (string_t)paVar2->pointer,aggr_input_data);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar7 = 0;
        do {
          uVar5 = uVar7;
          if (psVar4 != (sel_t *)0x0) {
            uVar5 = (ulong)psVar4[uVar7];
          }
          element_02.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + uVar5 * 0x10 + 8);
          element_02.value._0_8_ = *(undefined8 *)(local_78.data + uVar5 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_02
                     ,aggr_input_data);
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      uVar7 = 0;
      do {
        uVar5 = uVar7;
        if (psVar4 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar4[uVar7];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
             >> (uVar5 & 0x3f) & 1) != 0)) {
          element_01.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + uVar5 * 0x10 + 8);
          element_01.value._0_8_ = *(undefined8 *)(local_78.data + uVar5 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_01
                     ,aggr_input_data);
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}